

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O0

size_t google::protobuf::internal::WireFormatLite::
       MessageSize<CoreML::Specification::LowerTriangularLayerParams>
                 (LowerTriangularLayerParams *value)

{
  size_t sVar1;
  LowerTriangularLayerParams *value_local;
  
  sVar1 = CoreML::Specification::LowerTriangularLayerParams::ByteSizeLong(value);
  sVar1 = LengthDelimitedSize(sVar1);
  return sVar1;
}

Assistant:

inline size_t WireFormatLite::MessageSize(const MessageType& value) {
  return LengthDelimitedSize(value.ByteSizeLong());
}